

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O3

void __thiscall
kj::_::LogExpectation::logMessage
          (LogExpectation *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  StringPtr local_50;
  StringPtr local_40;
  
  if ((this->seen == false) && (this->severity == severity)) {
    local_50.content.size_ = (text->content).size_;
    if (local_50.content.size_ == 0) {
      local_50.content.ptr = "";
    }
    else {
      local_50.content.ptr = (text->content).ptr;
    }
    local_50.content.size_ = local_50.content.size_ + (local_50.content.size_ == 0);
    StringPtr::find(&local_40,&local_50);
    if ((char)local_40.content.ptr == '\x01') {
      this->seen = true;
      return;
    }
  }
  ExceptionCallback::logMessage(&this->super_ExceptionCallback,severity,file,line,contextDepth,text)
  ;
  return;
}

Assistant:

void LogExpectation::logMessage(
    LogSeverity severity, const char* file, int line, int contextDepth,
    String&& text) {
  if (!seen && severity == this->severity) {
    if (text.contains(substring)) {
      // Match. Ignore it.
      seen = true;
      return;
    }
  }

  // Pass up the chain.
  ExceptionCallback::logMessage(severity, file, line, contextDepth, kj::mv(text));
}